

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O2

void __thiscall
ON_SubDComponentRef::ON_SubDComponentRef(ON_SubDComponentRef *this,ON_SubDComponentRef *src)

{
  ON_Geometry::ON_Geometry(&this->super_ON_Geometry,&src->super_ON_Geometry);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_0082c4d8;
  ON_SubDRef::ON_SubDRef(&this->m_subd_ref,&src->m_subd_ref);
  (this->m_component_ptr).m_ptr = (src->m_component_ptr).m_ptr;
  this->m_component_index = src->m_component_index;
  this->m_component_location = src->m_component_location;
  this->m_reference_id = src->m_reference_id;
  return;
}

Assistant:

ON_SubDComponentRef::ON_SubDComponentRef(const ON_SubDComponentRef& src) ON_NOEXCEPT
  : ON_Geometry(src)
  , m_subd_ref(src.m_subd_ref)
  , m_component_ptr(src.m_component_ptr)
  , m_component_index(src.m_component_index)
  , m_component_location(src.m_component_location)
  , m_reference_id(src.m_reference_id)
{}